

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ForkBranch<unsigned_int>::get(ForkBranch<unsigned_int> *this,ExceptionOrValue *output)

{
  ExceptionOrValue *this_00;
  ExceptionOr<unsigned_int> *pEVar1;
  uint local_2c;
  uint *local_28;
  uint *value;
  ExceptionOr<unsigned_int> *hubResult;
  ExceptionOrValue *output_local;
  ForkBranch<unsigned_int> *this_local;
  
  hubResult = (ExceptionOr<unsigned_int> *)output;
  output_local = (ExceptionOrValue *)this;
  this_00 = ForkBranchBase::getHubResultRef(&this->super_ForkBranchBase);
  value = (uint *)ExceptionOrValue::as<unsigned_int>(this_00);
  local_28 = readMaybe<unsigned_int>(&((ExceptionOr<unsigned_int> *)value)->value);
  if (local_28 == (uint *)0x0) {
    pEVar1 = ExceptionOrValue::as<unsigned_int>(&hubResult->super_ExceptionOrValue);
    Maybe<unsigned_int>::operator=(&pEVar1->value,(void *)0x0);
  }
  else {
    local_2c = copyOrAddRef<unsigned_int>(local_28);
    pEVar1 = ExceptionOrValue::as<unsigned_int>(&hubResult->super_ExceptionOrValue);
    Maybe<unsigned_int>::operator=(&pEVar1->value,&local_2c);
  }
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)hubResult,(Maybe<kj::Exception> *)value);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,&hubResult->super_ExceptionOrValue);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(*value);
    } else {
      output.as<T>().value = nullptr;
    }